

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Secp256k1::NegatePubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *pubkey)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  uchar *puVar4;
  size_type inputlen;
  string *in_stack_fffffffffffffd60;
  string *message;
  size_type in_stack_fffffffffffffd68;
  CfdError CVar6;
  secp256k1_context *psVar5;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  allocator local_1f9;
  string local_1f8 [32];
  CfdSourceLocation local_1d8;
  size_type local_1c0;
  size_t byte_size;
  undefined1 local_1b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  string local_190 [32];
  CfdSourceLocation local_170;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  CfdSourceLocation local_130;
  undefined1 local_118 [8];
  secp256k1_pubkey pubkey_secp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey_data;
  int ret;
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  secp256k1_context *local_28;
  secp256k1_context *context;
  ByteData *pubkey_local;
  Secp256k1 *this_local;
  
  local_28 = (secp256k1_context *)this->secp256k1_context_;
  context = (secp256k1_context *)pubkey;
  pubkey_local = (ByteData *)this;
  this_local = (Secp256k1 *)__return_storage_ptr__;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffd68 >> 0x20);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x1a5;
    local_40.funcname = "NegatePubkeySecp256k1Ec";
    logger::warn<>(&local_40,"Secp256k1 context is NULL.");
    local_75 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"Secp256k1 context is NULL.",&local_61);
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),CVar6,
               in_stack_fffffffffffffd60);
    local_75 = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ByteData::GetDataSize(pubkey);
  if (sVar3 != 0x21) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffd68 >> 0x20);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x1aa;
    local_90.funcname = "NegatePubkeySecp256k1Ec";
    logger::warn<>(&local_90,"Invalid Argument pubkey size.");
    pubkey_data._6_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&ret,"Invalid Pubkey size.",(allocator *)((long)&pubkey_data + 7));
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),CVar6,
               in_stack_fffffffffffffd60);
    pubkey_data._6_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pubkey_secp.data + 0x38);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                     (ByteData *)context);
  psVar5 = local_28;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_00);
  inputlen = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  pubkey_data._0_4_ =
       secp256k1_ec_pubkey_parse(psVar5,(secp256k1_pubkey_conflict *)local_118,puVar4,inputlen);
  if ((int)pubkey_data != 1) {
    local_130.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffd68 >> 0x20);
    local_130.filename = local_130.filename + 1;
    local_130.line = 0x1b6;
    local_130.funcname = "NegatePubkeySecp256k1Ec";
    logger::warn<int&>(&local_130,"secp256k1_ec_pubkey_parse Error.({})",(int *)&pubkey_data);
    local_152 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_150,"Secp256k1 pubkey parse Error.",&local_151);
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),CVar6,
               in_stack_fffffffffffffd60);
    local_152 = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pubkey_data._0_4_ = secp256k1_ec_pubkey_negate(local_28,(secp256k1_pubkey_conflict *)local_118);
  if ((int)pubkey_data != 1) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffd68 >> 0x20);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x1bd;
    local_170.funcname = "NegatePubkeySecp256k1Ec";
    logger::warn<int&>(&local_170,"secp256k1_ec_pubkey_negate Error.({})",(int *)&pubkey_data);
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_190,"Secp256k1 pubkey negate Error.",
               (allocator *)
               ((long)&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),CVar6,
               in_stack_fffffffffffffd60);
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4b243d);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
             ,(allocator_type *)in_stack_fffffffffffffd60);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4b2463);
  message = (string *)local_1b0;
  local_1c0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  psVar5 = local_28;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4b2494);
  iVar1 = secp256k1_ec_pubkey_serialize
                    (psVar5,puVar4,&local_1c0,(secp256k1_pubkey_conflict *)local_118,0x102);
  pubkey_data._0_4_ = iVar1;
  if (iVar1 != 1) {
    local_1d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)psVar5 >> 0x20);
    local_1d8.filename = local_1d8.filename + 1;
    local_1d8.line = 0x1c8;
    local_1d8.funcname = "NegatePubkeySecp256k1Ec";
    logger::warn<int&>(&local_1d8,"secp256k1_ec_pubkey_serialize Error.({})",(int *)&pubkey_data);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1f8,"Secp256k1 pubkey serialize Error.",&local_1f9);
    CfdException::CfdException
              ((CfdException *)CONCAT44(iVar1,in_stack_fffffffffffffd70),CVar6,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(1,in_stack_fffffffffffffd70),(size_type)psVar5);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::NegatePubkeySecp256k1Ec(const ByteData& pubkey) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (pubkey.GetDataSize() != 33) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }

  int ret;
  const std::vector<uint8_t>& pubkey_data = pubkey.GetBytes();
  secp256k1_pubkey pubkey_secp;

  ret = secp256k1_ec_pubkey_parse(
      context, &pubkey_secp, pubkey_data.data(), pubkey_data.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }

  ret = secp256k1_ec_pubkey_negate(context, &pubkey_secp);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_negate Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey negate Error.");
  }

  std::vector<uint8_t> byte_data(65);
  size_t byte_size = byte_data.size();
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &pubkey_secp,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_serialize Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }
  byte_data.resize(byte_size);
  return ByteData(byte_data);
}